

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O0

size_t derDec(u32 *tag,octet **val,size_t *len,octet *der,size_t count)

{
  octet *in_RCX;
  size_t *in_RDX;
  u32 *in_RSI;
  size_t in_R8;
  size_t tl_count;
  size_t l;
  size_t local_38;
  size_t local_8;
  
  if (in_RDX == (size_t *)0x0) {
    in_RDX = &local_38;
  }
  local_8 = derTLDec(in_RSI,in_RDX,in_RCX,in_R8);
  if ((local_8 == 0xffffffffffffffff) || (in_R8 < local_8 + *in_RDX)) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    if (in_RSI != (u32 *)0x0) {
      *(octet **)in_RSI = in_RCX + local_8;
    }
    local_8 = local_8 + *in_RDX;
  }
  return local_8;
}

Assistant:

size_t derDec(u32* tag, const octet** val, size_t* len, const octet der[],
	size_t count)
{
	size_t l;
	size_t tl_count;
	// сделать len наверняка действительным
	if (!len)
		len = &l;
	// обработать TL
	tl_count = derTLDec(tag, len, der, count);
	if (tl_count == SIZE_MAX || tl_count + *len > count)
		return SIZE_MAX;
	// обработать V
	if (val)
	{
		ASSERT(memIsDisjoint2(val, sizeof(octet*), der, count));
		ASSERT(tag == 0 || memIsDisjoint2(val, sizeof(octet*), tag, 4));
		*val = der + tl_count;
	}
	// все нормально
	return tl_count + *len;
}